

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O2

bool __thiscall QFileDevice::setPermissions(QFileDevice *this,Permissions permissions)

{
  QObjectData *pQVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  iVar3 = (*pQVar1->_vptr_QObjectData[7])(pQVar1);
  cVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xb8))
                    ((long *)CONCAT44(extraout_var,iVar3),
                     permissions.super_QFlagsStorageHelper<QFileDevice::Permission,_4>.
                     super_QFlagsStorage<QFileDevice::Permission>.i);
  if (cVar2 == '\0') {
    QAbstractFileEngine::errorString
              ((QString *)&QStack_38,(QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
    *(undefined4 *)((long)&pQVar1[5].q_ptr + 4) = 0xd;
    QString::operator=((QString *)&pQVar1[4].children.d.size,(QString *)&QStack_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  }
  else {
    unsetError(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)cVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::setPermissions(Permissions permissions)
{
    Q_D(QFileDevice);
    if (d->engine()->setPermissions(permissions.toInt())) {
        unsetError();
        return true;
    }
    d->setError(QFile::PermissionsError, d->fileEngine->errorString());
    return false;
}